

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

IntBounds * __thiscall IntBounds::Clone(IntBounds *this)

{
  AllocatorType *this_00;
  JitArenaAllocator *alloc;
  IntBounds *this_01;
  TrackAllocData local_40;
  AllocatorType *local_18;
  JitArenaAllocator *allocator;
  IntBounds *this_local;
  
  allocator = (JitArenaAllocator *)this;
  this_00 = JsUtil::
            BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::GetAllocator(&(this->relativeLowerBounds).
                            super_BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          );
  local_18 = this_00;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IntBounds.cpp"
             ,0x22);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     &local_40);
  this_01 = (IntBounds *)new<Memory::JitArenaAllocator>(0x80,alloc,0x4e98c0);
  IntBounds(this_01,this);
  return this_01;
}

Assistant:

IntBounds *IntBounds::Clone() const
{
    JitArenaAllocator *const allocator = relativeLowerBounds.GetAllocator();
    return JitAnew(allocator, IntBounds, *this);
}